

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_NtkFindDivs_rec(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint local_34;
  int local_30;
  int Res;
  int i;
  int iFanin;
  int *pFanin;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_34 = 1;
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Acb_ObjSetTravIdCur(p,iObj);
    if (iVar1 == 0) {
      iVar1 = Acb_ObjIsCi(p,iObj);
      if (iVar1 == 0) {
        local_30 = 0;
        piVar3 = Acb_ObjFanins(p,iObj);
        for (; local_30 < *piVar3; local_30 = local_30 + 1) {
          uVar2 = Acb_NtkFindDivs_rec(p,piVar3[local_30 + 1]);
          local_34 = uVar2 & local_34;
        }
        if (local_34 != 0) {
          Acb_ObjSetTravIdPrev(p,iObj);
        }
        p_local._4_4_ = local_34;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Acb_NtkFindDivs_rec( Acb_Ntk_t * p, int iObj )
{
    int * pFanin, iFanin, i, Res = 1;
    if ( Acb_ObjIsTravIdPrev(p, iObj) )
        return 1;
    if ( Acb_ObjSetTravIdCur(p, iObj) )  
        return 0;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Res &= Acb_NtkFindDivs_rec( p, iFanin );
    if ( Res ) Acb_ObjSetTravIdPrev( p, iObj );
    return Res;
}